

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

Light pbrt::Light::Create(string *name,ParameterDictionary *parameters,Transform *renderFromLight,
                         CameraTransform *cameraTransform,Medium *outsideMedium,FileLoc *loc,
                         Allocator alloc)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_01;
  undefined1 auVar1 [16];
  Point2f p_00;
  Point3f p_01;
  Allocator alloc_00;
  undefined1 auVar2 [16];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  undefined1 auVar3 [16];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Vector3f w_00;
  bool bVar6;
  ulong uVar7;
  Tuple2<pbrt::Point2,_int> p_02;
  Point2i PVar8;
  reference pvVar9;
  Float *pFVar10;
  reference pPVar11;
  ParameterDictionary *in_RDX;
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  in_RDI;
  string *this;
  Float FVar12;
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar13;
  array<pbrt::WrapMode,_2> wrapMode;
  XYZ XVar14;
  RGB RVar15;
  Vector3f VVar16;
  Tuple3<pbrt::Point3,_float> TVar17;
  memory_resource *in_stack_00000010;
  Point3f *p;
  iterator __end10;
  iterator __begin10;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *__range10;
  Image image;
  Float k_e_2;
  int c_1;
  ImageChannelValues values;
  Vector3f w;
  Float u;
  int x_1;
  float v;
  int y_1;
  RGB lum;
  Image *image_1;
  float illuminance;
  ImageChannelDesc channelDesc;
  RGBColorSpace *colorSpace_1;
  int c;
  int x;
  int y;
  int res;
  RGB rgb;
  XYZ xyz;
  ImageAndMetadata imageAndMetadata;
  Float k_e_1;
  Float k_e;
  Float E_v;
  string filename;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> portal;
  Float scale;
  vector<pbrt::Spectrum,_std::allocator<pbrt::Spectrum>_> L;
  RGBColorSpace *colorSpace;
  Light *light;
  ProjectionLight *in_stack_fffffffffffff1e8;
  PortalImageInfiniteLight *pPVar18;
  ImageInfiniteLight *pIVar19;
  ImageAndMetadata *in_stack_fffffffffffff1f0;
  undefined4 in_stack_fffffffffffff1f8;
  WrapMode in_stack_fffffffffffff1fc;
  ImageInfiniteLight *in_stack_fffffffffffff200;
  Transform *in_stack_fffffffffffff208;
  undefined4 in_stack_fffffffffffff210;
  float in_stack_fffffffffffff214;
  Image *in_stack_fffffffffffff218;
  Float in_stack_fffffffffffff220;
  undefined4 in_stack_fffffffffffff224;
  Transform *in_stack_fffffffffffff228;
  undefined4 in_stack_fffffffffffff230;
  float in_stack_fffffffffffff234;
  float in_stack_fffffffffffff238;
  int in_stack_fffffffffffff23c;
  float in_stack_fffffffffffff240;
  int in_stack_fffffffffffff244;
  undefined4 in_stack_fffffffffffff248;
  float in_stack_fffffffffffff24c;
  undefined8 in_stack_fffffffffffff260;
  Image *in_stack_fffffffffffff268;
  int in_stack_fffffffffffff270;
  int in_stack_fffffffffffff274;
  undefined4 in_stack_fffffffffffff290;
  undefined4 in_stack_fffffffffffff294;
  Image *in_stack_fffffffffffff2c8;
  undefined4 in_stack_fffffffffffff2d0;
  undefined4 in_stack_fffffffffffff2d4;
  string *in_stack_fffffffffffff2d8;
  ColorEncoding *in_stack_fffffffffffff310;
  PixelFormat in_stack_fffffffffffff31c;
  undefined7 in_stack_fffffffffffff320;
  undefined1 in_stack_fffffffffffff327;
  Allocator in_stack_fffffffffffff328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff330;
  string *psVar20;
  size_t in_stack_fffffffffffff338;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffff340;
  ImageChannelDesc *in_stack_fffffffffffff3a8;
  undefined4 in_stack_fffffffffffff3b0;
  int in_stack_fffffffffffff3b4;
  Allocator in_stack_fffffffffffff3b8;
  ParameterDictionary *in_stack_fffffffffffff3c0;
  string *local_c28;
  FileLoc *in_stack_fffffffffffff498;
  RGBColorSpace *in_stack_fffffffffffff4a0;
  ParameterDictionary *in_stack_fffffffffffff4a8;
  undefined4 in_stack_fffffffffffff4b0;
  undefined4 in_stack_fffffffffffff4b4;
  Transform *in_stack_fffffffffffff4b8;
  Allocator in_stack_fffffffffffff4c0;
  __normal_iterator<pbrt::Point3<float>_*,_std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>_>
  local_a70;
  undefined1 *local_a68;
  memory_resource *local_a60;
  FileLoc *in_stack_fffffffffffff5f0;
  RGBColorSpace *in_stack_fffffffffffff5f8;
  ParameterDictionary *in_stack_fffffffffffff600;
  Transform *in_stack_fffffffffffff608;
  Allocator in_stack_fffffffffffff610;
  int local_98c;
  int local_914;
  int local_90c;
  int iStack_8f8;
  int local_8f4;
  RGB local_8dc;
  Image *local_8d0;
  float local_8c4;
  undefined1 local_8b4;
  allocator<char> local_8b3;
  allocator<char> local_8b2;
  allocator<char> local_8b1;
  string *local_8b0;
  string local_8a8 [32];
  undefined1 local_888 [32];
  undefined1 local_868 [32];
  string *local_848;
  undefined8 local_840;
  FileLoc *in_stack_fffffffffffff808;
  RGBColorSpace *in_stack_fffffffffffff810;
  ParameterDictionary *in_stack_fffffffffffff818;
  Medium *in_stack_fffffffffffff820;
  Transform *in_stack_fffffffffffff828;
  Allocator in_stack_fffffffffffff830;
  int local_5ec;
  int local_5e8;
  int local_5e4;
  ProjectionLight *local_5e0;
  allocator<char> local_5cb;
  allocator<char> local_5ca;
  allocator<char> local_5c9;
  string *local_5c8;
  string local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  string *local_560;
  undefined8 local_558;
  int local_49c;
  RGB local_498;
  undefined8 local_488;
  Float local_480;
  undefined8 local_478;
  Float local_470;
  RGB local_468;
  undefined8 local_458;
  Float local_450;
  undefined8 local_440;
  Float local_438;
  ParameterDictionary local_430;
  polymorphic_allocator<float> in_stack_fffffffffffffc48;
  string *in_stack_fffffffffffffc50;
  Allocator in_stack_fffffffffffffc58;
  FileLoc *in_stack_fffffffffffffc68;
  RGBColorSpace *in_stack_fffffffffffffc70;
  ParameterDictionary *in_stack_fffffffffffffc78;
  Medium *in_stack_fffffffffffffc80;
  Transform *in_stack_fffffffffffffc88;
  Allocator in_stack_fffffffffffffc90;
  FileLoc *in_stack_fffffffffffffd20;
  ParameterDictionary *in_stack_fffffffffffffd28;
  Medium *in_stack_fffffffffffffd30;
  Transform *in_stack_fffffffffffffd38;
  Allocator in_stack_fffffffffffffd40;
  allocator<char> local_229;
  string local_228 [32];
  Float local_208;
  allocator<char> local_201;
  string local_200 [39];
  allocator<char> local_1d9;
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [39];
  allocator<char> local_171;
  string local_170 [32];
  undefined1 local_150 [32];
  string local_130 [36];
  Float local_10c;
  memory_resource *local_108;
  allocator<char> local_e9;
  string local_e8 [32];
  vector<pbrt::Spectrum,_std::allocator<pbrt::Spectrum>_> local_c8;
  RGBColorSpace *local_b0;
  memory_resource *local_a8;
  memory_resource *local_98;
  memory_resource *local_80;
  memory_resource *local_68;
  polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  ParameterDictionary *local_20;
  memory_resource *local_10;
  
  local_10 = in_stack_00000010;
  local_20 = in_RDX;
  TaggedPointer((Light *)in_stack_fffffffffffff1f0,in_stack_fffffffffffff1e8);
  bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff1f0,(char *)in_stack_fffffffffffff1e8);
  if (bVar6) {
    Medium::Medium((Medium *)in_stack_fffffffffffff1f0,(Medium *)in_stack_fffffffffffff1e8);
    ParameterDictionary::ColorSpace(local_20);
    local_50.memoryResource = local_10;
    PointLight::Create(in_stack_fffffffffffff4b8,
                       (Medium *)CONCAT44(in_stack_fffffffffffff4b4,in_stack_fffffffffffff4b0),
                       in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0,in_stack_fffffffffffff498
                       ,in_stack_fffffffffffff4c0);
    TaggedPointer<pbrt::PointLight>
              ((Light *)in_stack_fffffffffffff1f0,(PointLight *)in_stack_fffffffffffff1e8);
    operator=((Light *)in_stack_fffffffffffff1f0,(Light *)in_stack_fffffffffffff1e8);
  }
  else {
    bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff1f0,(char *)in_stack_fffffffffffff1e8);
    if (bVar6) {
      Medium::Medium((Medium *)in_stack_fffffffffffff1f0,(Medium *)in_stack_fffffffffffff1e8);
      ParameterDictionary::ColorSpace(local_20);
      local_68 = local_10;
      SpotLight::Create(in_stack_fffffffffffff828,in_stack_fffffffffffff820,
                        in_stack_fffffffffffff818,in_stack_fffffffffffff810,
                        in_stack_fffffffffffff808,in_stack_fffffffffffff830);
      TaggedPointer<pbrt::SpotLight>
                ((Light *)in_stack_fffffffffffff1f0,(SpotLight *)in_stack_fffffffffffff1e8);
      operator=((Light *)in_stack_fffffffffffff1f0,(Light *)in_stack_fffffffffffff1e8);
    }
    else {
      bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff1f0,(char *)in_stack_fffffffffffff1e8);
      if (bVar6) {
        Medium::Medium((Medium *)in_stack_fffffffffffff1f0,(Medium *)in_stack_fffffffffffff1e8);
        ParameterDictionary::ColorSpace(local_20);
        local_80 = local_10;
        GoniometricLight::Create
                  (in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                   in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc90);
        TaggedPointer<pbrt::GoniometricLight>
                  ((Light *)in_stack_fffffffffffff1f0,(GoniometricLight *)in_stack_fffffffffffff1e8)
        ;
        operator=((Light *)in_stack_fffffffffffff1f0,(Light *)in_stack_fffffffffffff1e8);
      }
      else {
        bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff1f0,(char *)in_stack_fffffffffffff1e8);
        if (bVar6) {
          Medium::Medium((Medium *)in_stack_fffffffffffff1f0,(Medium *)in_stack_fffffffffffff1e8);
          local_98 = local_10;
          ProjectionLight::Create
                    (in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                     in_stack_fffffffffffffd20,in_stack_fffffffffffffd40);
          TaggedPointer<pbrt::ProjectionLight>
                    ((Light *)in_stack_fffffffffffff1f0,in_stack_fffffffffffff1e8);
          operator=((Light *)in_stack_fffffffffffff1f0,(Light *)in_stack_fffffffffffff1e8);
        }
        else {
          bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffff1f0,(char *)in_stack_fffffffffffff1e8);
          if (bVar6) {
            ParameterDictionary::ColorSpace(local_20);
            local_a8 = local_10;
            DistantLight::Create
                      (in_stack_fffffffffffff608,in_stack_fffffffffffff600,in_stack_fffffffffffff5f8
                       ,in_stack_fffffffffffff5f0,in_stack_fffffffffffff610);
            TaggedPointer<pbrt::DistantLight>
                      ((Light *)in_stack_fffffffffffff1f0,(DistantLight *)in_stack_fffffffffffff1e8)
            ;
            operator=((Light *)in_stack_fffffffffffff1f0,(Light *)in_stack_fffffffffffff1e8);
          }
          else {
            bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffff1f0,(char *)in_stack_fffffffffffff1e8);
            if (!bVar6) {
              ErrorExit<std::__cxx11::string_const&>
                        ((FileLoc *)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                         (char *)in_stack_fffffffffffff228,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220));
            }
            local_b0 = ParameterDictionary::ColorSpace(local_20);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                       (char *)in_stack_fffffffffffff228,
                       (allocator<char> *)
                       CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220));
            local_108 = local_10;
            alloc_00.memoryResource._4_4_ = in_stack_fffffffffffff24c;
            alloc_00.memoryResource._0_4_ = in_stack_fffffffffffff248;
            ParameterDictionary::GetSpectrumArray
                      ((ParameterDictionary *)
                       CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240),
                       (string *)CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238),
                       (SpectrumType)in_stack_fffffffffffff234,alloc_00);
            std::__cxx11::string::~string(local_e8);
            std::allocator<char>::~allocator(&local_e9);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                       (char *)in_stack_fffffffffffff228,
                       (allocator<char> *)
                       CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220));
            FVar12 = ParameterDictionary::GetOneFloat
                               ((ParameterDictionary *)in_stack_fffffffffffff1f0,
                                (string *)in_stack_fffffffffffff1e8,0.0);
            std::__cxx11::string::~string(local_130);
            std::allocator<char>::~allocator((allocator<char> *)(local_150 + 0x1f));
            local_10c = FVar12;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                       (char *)in_stack_fffffffffffff228,
                       (allocator<char> *)
                       CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220));
            ParameterDictionary::GetPoint3fArray
                      ((ParameterDictionary *)
                       CONCAT44(in_stack_fffffffffffff1fc,in_stack_fffffffffffff1f8),
                       (string *)in_stack_fffffffffffff1f0);
            std::__cxx11::string::~string(local_170);
            std::allocator<char>::~allocator(&local_171);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                       (char *)in_stack_fffffffffffff228,
                       (allocator<char> *)
                       CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220));
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                       (char *)in_stack_fffffffffffff228,
                       (allocator<char> *)
                       CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220));
            ParameterDictionary::GetOneString
                      ((ParameterDictionary *)
                       CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248),
                       (string *)CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240),
                       (string *)CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238));
            ResolveFilename(in_stack_fffffffffffff2d8);
            std::__cxx11::string::~string(local_1b8);
            std::__cxx11::string::~string(local_200);
            std::allocator<char>::~allocator(&local_201);
            std::__cxx11::string::~string(local_1d8);
            std::allocator<char>::~allocator(&local_1d9);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                       (char *)in_stack_fffffffffffff228,
                       (allocator<char> *)
                       CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220));
            FVar12 = ParameterDictionary::GetOneFloat
                               ((ParameterDictionary *)in_stack_fffffffffffff1f0,
                                (string *)in_stack_fffffffffffff1e8,0.0);
            std::__cxx11::string::~string(local_228);
            std::allocator<char>::~allocator(&local_229);
            local_208 = FVar12;
            bVar6 = std::vector<pbrt::Spectrum,_std::allocator<pbrt::Spectrum>_>::empty
                              ((vector<pbrt::Spectrum,_std::allocator<pbrt::Spectrum>_> *)
                               in_stack_fffffffffffff200);
            if (((bVar6) && (uVar7 = std::__cxx11::string::empty(), (uVar7 & 1) != 0)) &&
               (bVar6 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::
                        empty((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
                              in_stack_fffffffffffff200), bVar6)) {
              Spectrum::TaggedPointer<pbrt::DenselySampledSpectrum_const>
                        ((Spectrum *)in_stack_fffffffffffff1f0,
                         (DenselySampledSpectrum *)in_stack_fffffffffffff1e8);
              FVar12 = SpectrumToPhotometric((Spectrum *)in_stack_fffffffffffff200);
              local_10c = local_10c / FVar12;
              if (0.0 < local_208) {
                local_10c = (local_208 / 3.1415927) * local_10c;
              }
              pstd::pmr::polymorphic_allocator<std::byte>::
              new_object<pbrt::UniformInfiniteLight,pbrt::Transform_const&,pbrt::DenselySampledSpectrum_const*,float&>
                        ((polymorphic_allocator<std::byte> *)
                         CONCAT44(in_stack_fffffffffffff214,in_stack_fffffffffffff210),
                         in_stack_fffffffffffff208,
                         (DenselySampledSpectrum **)in_stack_fffffffffffff200,
                         (float *)CONCAT44(in_stack_fffffffffffff1fc,in_stack_fffffffffffff1f8));
              TaggedPointer<pbrt::UniformInfiniteLight>
                        ((Light *)in_stack_fffffffffffff1f0,
                         (UniformInfiniteLight *)in_stack_fffffffffffff1e8);
              operator=((Light *)in_stack_fffffffffffff1f0,(Light *)in_stack_fffffffffffff1e8);
            }
            else {
              bVar6 = std::vector<pbrt::Spectrum,_std::allocator<pbrt::Spectrum>_>::empty
                                ((vector<pbrt::Spectrum,_std::allocator<pbrt::Spectrum>_> *)
                                 in_stack_fffffffffffff200);
              if ((bVar6) ||
                 (bVar6 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::
                          empty((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                 *)in_stack_fffffffffffff200), !bVar6)) {
                ImageAndMetadata::ImageAndMetadata(in_stack_fffffffffffff1f0);
                uVar7 = std::__cxx11::string::empty();
                if ((uVar7 & 1) == 0) {
                  std::__cxx11::string::string((string *)&stack0xfffffffffffff820,local_198);
                  ColorEncoding::TaggedPointer
                            ((ColorEncoding *)in_stack_fffffffffffff1f0,in_stack_fffffffffffff1e8);
                  Image::Read(in_stack_fffffffffffffc50,in_stack_fffffffffffffc58,
                              (ColorEncoding *)in_stack_fffffffffffffc48.memoryResource);
                  ImageAndMetadata::operator=
                            (in_stack_fffffffffffff1f0,(ImageAndMetadata *)in_stack_fffffffffffff1e8
                            );
                  ImageAndMetadata::~ImageAndMetadata(in_stack_fffffffffffff1f0);
                  std::__cxx11::string::~string((string *)&stack0xfffffffffffff820);
                  bVar6 = Image::HasAnyInfinitePixels(in_stack_fffffffffffff218);
                  if (bVar6) {
                    ErrorExit<std::__cxx11::string&>
                              ((FileLoc *)
                               CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                               (char *)in_stack_fffffffffffff228,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220));
                  }
                  bVar6 = Image::HasAnyNaNPixels(in_stack_fffffffffffff218);
                  if (bVar6) {
                    ErrorExit<std::__cxx11::string&>
                              ((FileLoc *)
                               CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                               (char *)in_stack_fffffffffffff228,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220));
                  }
                }
                else {
                  uVar13 = extraout_XMM0_Qb;
                  std::vector<pbrt::Spectrum,_std::allocator<pbrt::Spectrum>_>::operator[]
                            (&local_c8,0);
                  bVar6 = TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
                          ::Is<pbrt::RGBIlluminantSpectrum>
                                    ((TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
                                      *)in_stack_fffffffffffff1f0);
                  if (!bVar6) {
                    Warning((FileLoc *)in_stack_fffffffffffff1f0,(char *)in_stack_fffffffffffff1e8);
                  }
                  std::vector<pbrt::Spectrum,_std::allocator<pbrt::Spectrum>_>::operator[]
                            (&local_c8,0);
                  Spectrum::Spectrum((Spectrum *)in_stack_fffffffffffff1f0,
                                     (Spectrum *)in_stack_fffffffffffff1e8);
                  XVar14 = SpectrumToXYZ((Spectrum *)
                                         CONCAT44(in_stack_fffffffffffff294,
                                                  in_stack_fffffffffffff290));
                  local_480 = XVar14.Z;
                  auVar5._8_8_ = uVar13;
                  auVar5._0_8_ = XVar14._0_8_;
                  local_488 = vmovlpd_avx(auVar5);
                  uVar13 = 0;
                  XVar14.Z = in_stack_fffffffffffff220;
                  XVar14._0_8_ = in_stack_fffffffffffff218;
                  local_478 = local_488;
                  local_470 = local_480;
                  local_458 = local_488;
                  local_450 = local_480;
                  local_440 = local_488;
                  local_438 = local_480;
                  RVar15 = RGBColorSpace::ToRGB((RGBColorSpace *)in_stack_fffffffffffff200,XVar14);
                  local_498.b = RVar15.b;
                  auVar4._8_8_ = uVar13;
                  auVar4._0_8_ = RVar15._0_8_;
                  local_498._0_8_ = vmovlpd_avx(auVar4);
                  local_49c = 1;
                  local_468._0_8_ = local_498._0_8_;
                  local_468.b = local_498.b;
                  Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffff1f0,
                                      (int)((ulong)in_stack_fffffffffffff1e8 >> 0x20),
                                      (int)in_stack_fffffffffffff1e8);
                  local_5c8 = local_5c0;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                             (char *)in_stack_fffffffffffff228,
                             (allocator<char> *)
                             CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220));
                  local_5c8 = (string *)local_5a0;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                             (char *)in_stack_fffffffffffff228,
                             (allocator<char> *)
                             CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220));
                  local_5c8 = (string *)local_580;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                             (char *)in_stack_fffffffffffff228,
                             (allocator<char> *)
                             CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220));
                  local_560 = local_5c0;
                  local_558 = 3;
                  v_00._M_array._4_4_ = in_stack_fffffffffffff1fc;
                  v_00._M_array._0_4_ = in_stack_fffffffffffff1f8;
                  v_00._M_len = (size_type)in_stack_fffffffffffff200;
                  pstd::
                  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffff1f0,v_00);
                  ColorEncoding::TaggedPointer
                            ((ColorEncoding *)in_stack_fffffffffffff1f0,in_stack_fffffffffffff1e8);
                  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
                            ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff1f0);
                  channels.n = in_stack_fffffffffffff338;
                  channels.ptr = in_stack_fffffffffffff330;
                  Image::Image((Image *)CONCAT17(in_stack_fffffffffffff327,in_stack_fffffffffffff320
                                                ),in_stack_fffffffffffff31c,
                               (Point2i)in_stack_fffffffffffff340,channels,in_stack_fffffffffffff310
                               ,in_stack_fffffffffffff328);
                  Image::operator=(&in_stack_fffffffffffff1f0->image,(Image *)local_5e0);
                  Image::~Image(&in_stack_fffffffffffff1f0->image);
                  local_c28 = (string *)&local_560;
                  in_stack_fffffffffffff1e8 = local_5e0;
                  do {
                    local_c28 = local_c28 + -0x20;
                    std::__cxx11::string::~string(local_c28);
                  } while (local_c28 != local_5c0);
                  std::allocator<char>::~allocator(&local_5cb);
                  std::allocator<char>::~allocator(&local_5ca);
                  std::allocator<char>::~allocator(&local_5c9);
                  pstd::optional<const_pbrt::RGBColorSpace_*>::operator=
                            ((optional<const_pbrt::RGBColorSpace_*> *)in_stack_fffffffffffff1f0,
                             (RGBColorSpace **)in_stack_fffffffffffff1e8);
                  for (local_5e4 = 0; local_5e4 < local_49c; local_5e4 = local_5e4 + 1) {
                    for (local_5e8 = 0; local_5e8 < local_49c; local_5e8 = local_5e8 + 1) {
                      for (local_5ec = 0; local_5ec < 3; local_5ec = local_5ec + 1) {
                        in_stack_fffffffffffff3c0 = &local_430;
                        Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffff1f0,
                                            (int)((ulong)in_stack_fffffffffffff1e8 >> 0x20),
                                            (int)in_stack_fffffffffffff1e8);
                        in_stack_fffffffffffff3b4 = local_5ec;
                        in_stack_fffffffffffff3b8.memoryResource =
                             (memory_resource *)RGB::operator[](&local_468,local_5ec);
                        PVar8.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffff274;
                        PVar8.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffff270;
                        Image::SetChannel(in_stack_fffffffffffff268,PVar8,
                                          (int)((ulong)in_stack_fffffffffffff260 >> 0x20),
                                          (Float)in_stack_fffffffffffff260);
                      }
                    }
                  }
                }
                ImageMetadata::GetColorSpace((ImageMetadata *)in_stack_fffffffffffff1e8);
                local_8b4 = 1;
                local_8b0 = local_8a8;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                           (char *)in_stack_fffffffffffff228,
                           (allocator<char> *)
                           CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220));
                local_8b0 = (string *)local_888;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                           (char *)in_stack_fffffffffffff228,
                           (allocator<char> *)
                           CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220));
                local_8b0 = (string *)local_868;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                           (char *)in_stack_fffffffffffff228,
                           (allocator<char> *)
                           CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220));
                local_8b4 = 0;
                local_848 = local_8a8;
                local_840 = 3;
                v_01._M_array._4_4_ = in_stack_fffffffffffff1fc;
                v_01._M_array._0_4_ = in_stack_fffffffffffff1f8;
                v_01._M_len = (size_type)in_stack_fffffffffffff200;
                pstd::
                span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffff1f0,v_01);
                requestedChannels.ptr._4_4_ = in_stack_fffffffffffff2d4;
                requestedChannels.ptr._0_4_ = in_stack_fffffffffffff2d0;
                requestedChannels.n = (size_t)in_stack_fffffffffffff2d8;
                Image::GetChannelDesc(in_stack_fffffffffffff2c8,requestedChannels);
                psVar20 = local_8a8;
                this = (string *)&local_848;
                do {
                  this = this + -0x20;
                  std::__cxx11::string::~string(this);
                } while (this != psVar20);
                std::allocator<char>::~allocator(&local_8b3);
                std::allocator<char>::~allocator(&local_8b2);
                std::allocator<char>::~allocator(&local_8b1);
                bVar6 = ImageChannelDesc::operator_cast_to_bool((ImageChannelDesc *)0x8cf5e4);
                if (!bVar6) {
                  ErrorExit<std::__cxx11::string&>
                            ((FileLoc *)
                             CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                             (char *)in_stack_fffffffffffff228,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220));
                }
                Spectrum::TaggedPointer<pbrt::DenselySampledSpectrum_const>
                          ((Spectrum *)in_stack_fffffffffffff1f0,
                           (DenselySampledSpectrum *)in_stack_fffffffffffff1e8);
                FVar12 = SpectrumToPhotometric((Spectrum *)in_stack_fffffffffffff200);
                local_10c = local_10c / FVar12;
                wrapMode.values[0] = Black;
                wrapMode.values[1] = Black;
                if (0.0 < local_208) {
                  local_8c4 = 0.0;
                  local_8d0 = (Image *)&local_430;
                  p_02 = (Tuple2<pbrt::Point2,_int>)
                         ImageMetadata::GetColorSpace((ImageMetadata *)in_stack_fffffffffffff1e8);
                  RVar15 = RGBColorSpace::LuminanceVector
                                     ((RGBColorSpace *)
                                      CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240))
                  ;
                  local_8dc.b = RVar15.b;
                  auVar3._8_4_ = wrapMode.values[0];
                  auVar3._12_4_ = wrapMode.values[1];
                  auVar3._0_8_ = RVar15._0_8_;
                  local_8dc._0_8_ = vmovlpd_avx(auVar3);
                  local_8f4 = 0;
                  while( true ) {
                    PVar8 = Image::Resolution(local_8d0);
                    iStack_8f8 = PVar8.super_Tuple2<pbrt::Point2,_int>.y;
                    if (iStack_8f8 <= local_8f4) break;
                    Image::Resolution(local_8d0);
                    local_90c = 0;
                    while( true ) {
                      PVar8 = Image::Resolution(local_8d0);
                      local_914 = PVar8.super_Tuple2<pbrt::Point2,_int>.x;
                      if (local_914 <= local_90c) break;
                      Image::Resolution(local_8d0);
                      Point2<float>::Point2
                                ((Point2<float> *)in_stack_fffffffffffff1f0,
                                 (float)((ulong)in_stack_fffffffffffff1e8 >> 0x20),
                                 SUB84(in_stack_fffffffffffff1e8,0));
                      uVar13 = 0;
                      p_00.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffff238;
                      p_00.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffff234;
                      VVar16 = EqualAreaSquareToSphere(p_00);
                      auVar2._8_8_ = uVar13;
                      auVar2._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                      uVar13 = vmovlpd_avx(auVar2);
                      if (0.0 < VVar16.super_Tuple3<pbrt::Vector3,_float>.z) {
                        Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffff1f0,
                                            (int)((ulong)in_stack_fffffffffffff1e8 >> 0x20),
                                            (int)in_stack_fffffffffffff1e8);
                        WrapMode2D::WrapMode2D
                                  ((WrapMode2D *)in_stack_fffffffffffff200,in_stack_fffffffffffff1fc
                                  );
                        Image::GetChannels(RVar15._0_8_,(Point2i)p_02,(WrapMode2D)wrapMode.values);
                        for (local_98c = 0; local_98c < 3; local_98c = local_98c + 1) {
                          pvVar9 = InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                   ::operator[]((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                                 *)in_stack_fffffffffffff1f0,
                                                (size_type)in_stack_fffffffffffff1e8);
                          in_stack_fffffffffffff24c = *pvVar9;
                          pFVar10 = RGB::operator[](&local_8dc,local_98c);
                          in_stack_fffffffffffff24c = in_stack_fffffffffffff24c * *pFVar10;
                          w_00.super_Tuple3<pbrt::Vector3,_float>.z =
                               VVar16.super_Tuple3<pbrt::Vector3,_float>.z;
                          w_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar13;
                          w_00.super_Tuple3<pbrt::Vector3,_float>.y =
                               (float)(int)((ulong)uVar13 >> 0x20);
                          FVar12 = CosTheta(w_00);
                          local_8c4 = in_stack_fffffffffffff24c * FVar12 + local_8c4;
                        }
                        ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x8cfc1f);
                      }
                      local_90c = local_90c + 1;
                    }
                    local_8f4 = local_8f4 + 1;
                  }
                  PVar8 = Image::Resolution(local_8d0);
                  in_stack_fffffffffffff234 = (float)PVar8.super_Tuple2<pbrt::Point2,_int>.x;
                  in_stack_fffffffffffff244 = PVar8.super_Tuple2<pbrt::Point2,_int>.y;
                  in_stack_fffffffffffff240 = in_stack_fffffffffffff234;
                  PVar8 = Image::Resolution(local_8d0);
                  in_stack_fffffffffffff238 = (float)PVar8.super_Tuple2<pbrt::Point2,_int>.x;
                  in_stack_fffffffffffff23c = PVar8.super_Tuple2<pbrt::Point2,_int>.y;
                  local_8c4 = (6.2831855 /
                              (float)((int)in_stack_fffffffffffff234 * in_stack_fffffffffffff23c)) *
                              local_8c4;
                  local_10c = (local_208 / local_8c4) * local_10c;
                }
                local_a60 = local_10;
                Image::SelectChannels
                          ((Image *)CONCAT44(in_stack_fffffffffffff3b4,in_stack_fffffffffffff3b0),
                           in_stack_fffffffffffff3a8,in_stack_fffffffffffff3b8);
                bVar6 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::
                        empty((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
                              in_stack_fffffffffffff200);
                if (bVar6) {
                  pIVar19 = (ImageInfiniteLight *)&stack0xfffffffffffffff0;
                  in_stack_fffffffffffff200 =
                       pstd::pmr::polymorphic_allocator<std::byte>::
                       new_object<pbrt::ImageInfiniteLight,pbrt::Transform_const&,pbrt::Image,pbrt::RGBColorSpace_const*&,float&,std::__cxx11::string&,pstd::pmr::polymorphic_allocator<std::byte>&>
                                 ((polymorphic_allocator<std::byte> *)
                                  CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                                  in_stack_fffffffffffff228,
                                  (Image *)CONCAT44(in_stack_fffffffffffff224,
                                                    in_stack_fffffffffffff220),
                                  (RGBColorSpace **)in_stack_fffffffffffff218,
                                  (float *)CONCAT44(in_stack_fffffffffffff214,
                                                    in_stack_fffffffffffff210),
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffff208,
                                  (polymorphic_allocator<std::byte> *)
                                  CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240));
                  TaggedPointer<pbrt::ImageInfiniteLight>
                            ((Light *)in_stack_fffffffffffff1f0,pIVar19);
                  operator=((Light *)in_stack_fffffffffffff1f0,(Light *)pIVar19);
                }
                else {
                  local_a68 = local_150;
                  local_a70._M_current =
                       (Point3<float> *)
                       std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::
                       begin((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
                             in_stack_fffffffffffff1e8);
                  std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::end
                            ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
                             in_stack_fffffffffffff1e8);
                  TVar17.z = in_stack_fffffffffffff214;
                  TVar17._0_8_ = in_stack_fffffffffffff218;
                  while( true ) {
                    bVar6 = __gnu_cxx::operator!=
                                      ((__normal_iterator<pbrt::Point3<float>_*,_std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>_>
                                        *)in_stack_fffffffffffff1f0,
                                       (__normal_iterator<pbrt::Point3<float>_*,_std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>_>
                                        *)in_stack_fffffffffffff1e8);
                    if (!bVar6) break;
                    pPVar11 = __gnu_cxx::
                              __normal_iterator<pbrt::Point3<float>_*,_std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>_>
                              ::operator*(&local_a70);
                    uVar13 = 0;
                    p_01.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffff23c;
                    p_01.super_Tuple3<pbrt::Point3,_float>.x = in_stack_fffffffffffff238;
                    p_01.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff240;
                    TVar17 = (Tuple3<pbrt::Point3,_float>)
                             CameraTransform::RenderFromWorld
                                       ((CameraTransform *)
                                        CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220
                                                ),p_01);
                    in_stack_fffffffffffff220 = (Float)uVar13;
                    in_stack_fffffffffffff224 = (undefined4)((ulong)uVar13 >> 0x20);
                    auVar1._8_4_ = in_stack_fffffffffffff220;
                    auVar1._0_8_ = TVar17._0_8_;
                    auVar1._12_4_ = in_stack_fffffffffffff224;
                    uVar13 = vmovlpd_avx(auVar1);
                    (pPVar11->super_Tuple3<pbrt::Point3,_float>).x = (float)(int)uVar13;
                    (pPVar11->super_Tuple3<pbrt::Point3,_float>).y =
                         (float)(int)((ulong)uVar13 >> 0x20);
                    (pPVar11->super_Tuple3<pbrt::Point3,_float>).z = TVar17.z;
                    __gnu_cxx::
                    __normal_iterator<pbrt::Point3<float>_*,_std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>_>
                    ::operator++(&local_a70);
                  }
                  in_stack_fffffffffffff1f0 = (ImageAndMetadata *)&stack0xfffffffffffffff0;
                  pPVar18 = (PortalImageInfiniteLight *)local_150;
                  pstd::pmr::polymorphic_allocator<std::byte>::
                  new_object<pbrt::PortalImageInfiniteLight,pbrt::Transform_const&,pbrt::Image,pbrt::RGBColorSpace_const*&,float&,std::__cxx11::string&,std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>&,pstd::pmr::polymorphic_allocator<std::byte>&>
                            ((polymorphic_allocator<std::byte> *)
                             CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                             in_stack_fffffffffffff228,
                             (Image *)CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220),
                             TVar17._0_8_,(float *)CONCAT44(TVar17.z,in_stack_fffffffffffff210),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff208,
                             (vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
                             CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240),
                             (polymorphic_allocator<std::byte> *)
                             CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248));
                  TaggedPointer<pbrt::PortalImageInfiniteLight>
                            ((Light *)in_stack_fffffffffffff1f0,pPVar18);
                  operator=((Light *)in_stack_fffffffffffff1f0,(Light *)pPVar18);
                }
                Image::~Image(&in_stack_fffffffffffff1f0->image);
                ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x8cffb4);
                ImageAndMetadata::~ImageAndMetadata(in_stack_fffffffffffff1f0);
              }
              else {
                uVar7 = std::__cxx11::string::empty();
                if ((uVar7 & 1) == 0) {
                  ErrorExit((FileLoc *)in_stack_fffffffffffff1f0,(char *)in_stack_fffffffffffff1e8);
                }
                std::vector<pbrt::Spectrum,_std::allocator<pbrt::Spectrum>_>::operator[]
                          (&local_c8,0);
                Spectrum::Spectrum((Spectrum *)in_stack_fffffffffffff1f0,
                                   (Spectrum *)in_stack_fffffffffffff1e8);
                FVar12 = SpectrumToPhotometric((Spectrum *)in_stack_fffffffffffff200);
                local_10c = local_10c / FVar12;
                if (0.0 < local_208) {
                  local_10c = (local_208 / 3.1415927) * local_10c;
                }
                std::vector<pbrt::Spectrum,_std::allocator<pbrt::Spectrum>_>::operator[]
                          (&local_c8,0);
                pstd::pmr::polymorphic_allocator<std::byte>::
                new_object<pbrt::UniformInfiniteLight,pbrt::Transform_const&,pbrt::Spectrum&,float&>
                          ((polymorphic_allocator<std::byte> *)
                           CONCAT44(in_stack_fffffffffffff214,in_stack_fffffffffffff210),
                           in_stack_fffffffffffff208,(Spectrum *)in_stack_fffffffffffff200,
                           (float *)CONCAT44(in_stack_fffffffffffff1fc,in_stack_fffffffffffff1f8));
                TaggedPointer<pbrt::UniformInfiniteLight>
                          ((Light *)in_stack_fffffffffffff1f0,
                           (UniformInfiniteLight *)in_stack_fffffffffffff1e8);
                operator=((Light *)in_stack_fffffffffffff1f0,(Light *)in_stack_fffffffffffff1e8);
              }
            }
            std::__cxx11::string::~string(local_198);
            std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::~vector
                      ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
                       in_stack_fffffffffffff200);
            std::vector<pbrt::Spectrum,_std::allocator<pbrt::Spectrum>_>::~vector
                      ((vector<pbrt::Spectrum,_std::allocator<pbrt::Spectrum>_> *)
                       in_stack_fffffffffffff200);
          }
        }
      }
    }
  }
  bVar6 = pbrt::TaggedPointer::operator_cast_to_bool((TaggedPointer *)in_RDI.bits);
  if (bVar6) {
    ParameterDictionary::ReportUnused(in_stack_fffffffffffff3c0);
    return (Light)(TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                   )in_RDI.bits;
  }
  ErrorExit<std::__cxx11::string_const&>
            ((FileLoc *)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
             (char *)in_stack_fffffffffffff228,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220));
}

Assistant:

Light Light::Create(const std::string &name, const ParameterDictionary &parameters,
                    const Transform &renderFromLight,
                    const CameraTransform &cameraTransform, Medium outsideMedium,
                    const FileLoc *loc, Allocator alloc) {
    Light light = nullptr;
    if (name == "point")
        light = PointLight::Create(renderFromLight, outsideMedium, parameters,
                                   parameters.ColorSpace(), loc, alloc);
    else if (name == "spot")
        light = SpotLight::Create(renderFromLight, outsideMedium, parameters,
                                  parameters.ColorSpace(), loc, alloc);
    else if (name == "goniometric")
        light = GoniometricLight::Create(renderFromLight, outsideMedium, parameters,
                                         parameters.ColorSpace(), loc, alloc);
    else if (name == "projection")
        light = ProjectionLight::Create(renderFromLight, outsideMedium, parameters, loc,
                                        alloc);
    else if (name == "distant")
        light = DistantLight::Create(renderFromLight, parameters, parameters.ColorSpace(),
                                     loc, alloc);
    else if (name == "infinite") {
        const RGBColorSpace *colorSpace = parameters.ColorSpace();
        std::vector<Spectrum> L =
            parameters.GetSpectrumArray("L", SpectrumType::Illuminant, alloc);
        Float scale = parameters.GetOneFloat("scale", 1);
        std::vector<Point3f> portal = parameters.GetPoint3fArray("portal");
        std::string filename = ResolveFilename(parameters.GetOneString("filename", ""));
        Float E_v = parameters.GetOneFloat("illuminance", -1);

        if (L.empty() && filename.empty() && portal.empty()) {
            // Scale the light spectrum to be equivalent to 1 nit
            scale /= SpectrumToPhotometric(&colorSpace->illuminant);
            if (E_v > 0) {
                // If the scene specifies desired illuminance, first calculate
                // the illuminance from a uniform hemispherical emission
                // of L_v then use this to scale the emission spectrum.
                Float k_e = Pi;
                scale *= E_v / k_e;
            }

            // Default: color space's std illuminant
            light = alloc.new_object<UniformInfiniteLight>(
                renderFromLight, &colorSpace->illuminant, scale);
        } else if (!L.empty() && portal.empty()) {
            if (!filename.empty())
                ErrorExit(loc, "Can't specify both emission \"L\" and "
                               "\"filename\" with ImageInfiniteLight");

            // Scale the light spectrum to be equivalent to 1 nit
            scale /= SpectrumToPhotometric(L[0]);

            if (E_v > 0) {
                // If the scene specifies desired illuminance, first calculate
                // the illuminance from a uniform hemispherical emission
                // of L_v then use this to scale the emission spectrum.
                Float k_e = Pi;
                scale *= E_v / k_e;
            }

            light = alloc.new_object<UniformInfiniteLight>(renderFromLight, L[0], scale);
        } else {
            // Either an image was provided or it's "L" with a portal.
            ImageAndMetadata imageAndMetadata;
            if (filename.empty()) {
                // Create a uniform image with the L spectrum converted to
                // RGB so it can be stored in an Image. This usually should
                // be ok, but it is the best we can do under the circumstances.
                // (More generally, for uniform L, it's just as well to create
                // an emissive bilinear patch at the portal location, though
                // that doesn't allow things like putting an emissive sphere out
                // there for the sun, so here we go...
                if (!L[0].Is<RGBIlluminantSpectrum>())
                    Warning(loc, "Converting non-RGB \"L\" parameter to RGB so that a "
                                 "portal light can be used.");
                XYZ xyz = SpectrumToXYZ(L[0]);
                RGB rgb = RGBColorSpace::sRGB->ToRGB(xyz);

                int res = 1;  // happily, this all just works.
                imageAndMetadata.image =
                    Image(PixelFormat::Float, {res, res}, {"R", "G", "B"});
                imageAndMetadata.metadata.colorSpace = RGBColorSpace::sRGB;
                for (int y = 0; y < res; ++y)
                    for (int x = 0; x < res; ++x)
                        for (int c = 0; c < 3; ++c)
                            imageAndMetadata.image.SetChannel({x, y}, c, rgb[c]);
            } else {
                imageAndMetadata = Image::Read(filename, alloc);

                if (imageAndMetadata.image.HasAnyInfinitePixels())
                    ErrorExit(loc,
                              "%s: image has infinite pixel values and so is not "
                              "suitable as a light.",
                              filename);
                if (imageAndMetadata.image.HasAnyNaNPixels())
                    ErrorExit(loc,
                              "%s: image has not-a-number pixel values and so is not "
                              "suitable as a light.",
                              filename);
            }

            const RGBColorSpace *colorSpace = imageAndMetadata.metadata.GetColorSpace();

            ImageChannelDesc channelDesc =
                imageAndMetadata.image.GetChannelDesc({"R", "G", "B"});
            if (!channelDesc)
                ErrorExit(loc,
                          "%s: image provided to \"infinite\" light must "
                          "have R, G, and B channels.",
                          filename);

            // Scale the light spectrum to be equivalent to 1 nit
            scale /= SpectrumToPhotometric(&colorSpace->illuminant);

            if (E_v > 0) {
                // Upper hemisphere illuminance calculation for converting map to physical
                // units
                float illuminance = 0;
                const Image &image = imageAndMetadata.image;
                RGB lum = imageAndMetadata.metadata.GetColorSpace()->LuminanceVector();
                for (int y = 0; y < image.Resolution().y; ++y) {
                    float v = (float(y) + 0.5f) / float(image.Resolution().y);
                    for (int x = 0; x < image.Resolution().x; ++x) {
                        Float u = (x + 0.5f) / image.Resolution().x;
                        Vector3f w = EqualAreaSquareToSphere(Point2f(u, v));
                        // We could be more clever and see if we're in the inner rotated
                        // square, but not a big deal...
                        if (w.z <= 0)
                            continue;

                        ImageChannelValues values = image.GetChannels({x, y});
                        for (int c = 0; c < 3; ++c)
                            illuminance += values[c] * lum[c] * CosTheta(w);
                    }
                }
                illuminance *= 2 * Pi / (image.Resolution().x * image.Resolution().y);

                // scaling factor is just the ratio of the target
                // illuminance and the illuminance of the map multiplied by
                // the illuminant spectrum
                Float k_e = illuminance;
                scale *= E_v / k_e;
            }

            Image image = imageAndMetadata.image.SelectChannels(channelDesc, alloc);

            if (!portal.empty()) {
                for (Point3f &p : portal)
                    p = cameraTransform.RenderFromWorld(p);

                light = alloc.new_object<PortalImageInfiniteLight>(
                    renderFromLight, std::move(image), colorSpace, scale, filename,
                    portal, alloc);
            } else
                light = alloc.new_object<ImageInfiniteLight>(renderFromLight,
                                                             std::move(image), colorSpace,
                                                             scale, filename, alloc);
        }
    } else
        ErrorExit(loc, "%s: light type unknown.", name);

    if (!light)
        ErrorExit(loc, "%s: unable to create light.", name);

    parameters.ReportUnused();
    return light;
}